

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void uv__chld(uv_signal_t *handle,int signum)

{
  QUEUE *papvVar1;
  void **ppvVar2;
  int *piVar3;
  bool bVar4;
  QUEUE *h;
  QUEUE *q;
  QUEUE pending;
  pid_t pid;
  int status;
  int term_signal;
  int exit_status;
  uv_loop_t *loop;
  uv_process_t *process;
  int signum_local;
  uv_signal_t *handle_local;
  
  if (signum != 0x11) {
    __assert_fail("signum == SIGCHLD",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                  ,0x3b,"void uv__chld(uv_signal_t *, int)");
  }
  q = (QUEUE *)&q;
  pending[0] = &q;
  ppvVar2 = handle->loop->process_handles;
  papvVar1 = (QUEUE *)*ppvVar2;
  while (h = papvVar1, h != (QUEUE *)ppvVar2) {
    papvVar1 = (QUEUE *)(*h)[0];
    do {
      pending[1]._0_4_ = waitpid(*(__pid_t *)(h[-1] + 1),(int *)((long)pending + 0xc),1);
      bVar4 = false;
      if ((__pid_t)pending[1] == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if ((__pid_t)pending[1] != 0) {
      if ((__pid_t)pending[1] == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 10) {
          abort();
        }
      }
      else {
        *(undefined4 *)h[1] = pending[1]._4_4_;
        *(void **)(*h)[1] = (*h)[0];
        *(void **)((long)(*h)[0] + 8) = (*h)[1];
        (*h)[0] = &q;
        (*h)[1] = pending[0];
        *(QUEUE **)(*h)[1] = h;
        pending[0] = h;
      }
    }
  }
  papvVar1 = q;
  while (h = papvVar1, h != (QUEUE *)&q) {
    papvVar1 = (QUEUE *)(*h)[0];
    *(void **)(*h)[1] = (*h)[0];
    *(void **)((long)(*h)[0] + 8) = (*h)[1];
    (*h)[0] = h;
    (*h)[1] = h;
    if ((((ulong)h[-2][1] & 0x4000) != 0) &&
       (*(uint *)(h[-2] + 1) = *(uint *)(h[-2] + 1) & 0xffffbfff, ((ulong)h[-2][1] & 0x2000) != 0))
    {
      *(int *)((long)h[-7][1] + 8) = *(int *)((long)h[-7][1] + 8) + -1;
    }
    if (h[-1][0] != (void *)0x0) {
      status = 0;
      if (((ulong)h[1][0] & 0x7f) == 0) {
        status = (int)(*(uint *)h[1] & 0xff00) >> 8;
      }
      pid = 0;
      if ('\0' < (char)(((byte)*(undefined4 *)h[1] & 0x7f) + 1) >> 1) {
        pid = *(uint *)h[1] & 0x7f;
      }
      (*(code *)h[-1][0])(h + -7,status,pid);
    }
  }
  if ((QUEUE *)&q == q) {
    return;
  }
  __assert_fail("QUEUE_EMPTY(&pending)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                ,0x6f,"void uv__chld(uv_signal_t *, int)");
}

Assistant:

static void uv__chld(uv_signal_t* handle, int signum) {
  uv_process_t* process;
  uv_loop_t* loop;
  int exit_status;
  int term_signal;
  int status;
  pid_t pid;
  QUEUE pending;
  QUEUE* q;
  QUEUE* h;

  assert(signum == SIGCHLD);

  QUEUE_INIT(&pending);
  loop = handle->loop;

  h = &loop->process_handles;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    do
      pid = waitpid(process->pid, &status, WNOHANG);
    while (pid == -1 && errno == EINTR);

    if (pid == 0)
      continue;

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      continue;
    }

    process->status = status;
    QUEUE_REMOVE(&process->queue);
    QUEUE_INSERT_TAIL(&pending, &process->queue);
  }

  h = &pending;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    QUEUE_REMOVE(&process->queue);
    QUEUE_INIT(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(QUEUE_EMPTY(&pending));
}